

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcPth.c
# Opt level: O2

void * Wla_Bmc3Thread(void *pArg)

{
  int *piVar1;
  Wla_Man_t *pWla;
  long lVar2;
  uint __line;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pAVar4;
  char *__assertion;
  Saig_ParBmc_t BmcPars;
  
  pNtk = Abc_NtkFromAigPhase(*(Aig_Man_t **)((long)pArg + 8));
  Saig_ParBmcSetDefaultParams(&BmcPars);
  BmcPars.pFuncStop = Wla_CallBackToStop;
  BmcPars.RunId = *(int *)((long)pArg + 0x18);
  if (*(int *)(*(long *)(*pArg + 8) + 0x48) != 0) {
    BmcPars.nFramesMax = *(int *)(*pArg + 0x50) + 10;
  }
  pAVar4 = pNtk;
  iVar3 = Abc_NtkDarBmc3(pNtk,&BmcPars,0);
  if (iVar3 == -1) {
    if ((*(int *)((long)pArg + 0x18) < g_nRunIds) && (*(int *)((long)pArg + 0x1c) != 0)) {
      Abc_Print((int)pAVar4,"Bmc3 was cancelled. RunId=%d.\n");
    }
    pWla = *pArg;
    if ((1 < pWla->nIters) && (*(int *)((long)pArg + 0x18) == g_nRunIds)) {
      iVar3 = Wla_ManShrinkAbs(pWla,pWla->iCexFrame + 10,*(int *)((long)pArg + 0x18));
      lVar2 = *pArg;
      piVar1 = (int *)(lVar2 + 0x50);
      *piVar1 = *piVar1 + 10;
      if (iVar3 == 1) {
        *(undefined4 *)(lVar2 + 0x54) = 1;
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
        if (iVar3 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                        ,0x80,"void *Wla_Bmc3Thread(void *)");
        }
        g_nRunIds = g_nRunIds + 1;
        iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
        if (iVar3 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                        ,0x82,"void *Wla_Bmc3Thread(void *)");
        }
      }
    }
  }
  else if (iVar3 == 0) {
    if (pNtk->pSeqModel == (Abc_Cex_t *)0x0) {
      __assertion = "pAbcNtk->pSeqModel";
      __line = 0x68;
    }
    else {
      **(long **)((long)pArg + 0x10) = (long)pNtk->pSeqModel;
      pNtk->pSeqModel = (Abc_Cex_t *)0x0;
      if (*(int *)((long)pArg + 0x1c) != 0) {
        Abc_Print((int)pAVar4,"Bmc3 found CEX. RunId=%d.\n",(ulong)*(uint *)((long)pArg + 0x18));
      }
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
      if (iVar3 == 0) {
        g_nRunIds = g_nRunIds + 1;
        iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
        if (iVar3 == 0) goto LAB_006da70f;
        __assertion = "status == 0";
        __line = 0x71;
      }
      else {
        __assertion = "status == 0";
        __line = 0x6f;
      }
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcPth.c"
                  ,__line,"void *Wla_Bmc3Thread(void *)");
  }
LAB_006da70f:
  Abc_NtkDelete(pNtk);
  Aig_ManStop(*(Aig_Man_t **)((long)pArg + 8));
  free(pArg);
  pthread_exit((void *)0x0);
}

Assistant:

void * Wla_Bmc3Thread ( void * pArg )
{
    int status;
    int RetValue = -1;
    int nFramesNoChangeLim = 10;
    Bmc3_ThData_t * pData = (Bmc3_ThData_t *)pArg;
    Abc_Ntk_t * pAbcNtk = Abc_NtkFromAigPhase( pData->pAig );
    Saig_ParBmc_t BmcPars, *pBmcPars = &BmcPars;
    Saig_ParBmcSetDefaultParams( pBmcPars );
    pBmcPars->pFuncStop = Wla_CallBackToStop;
    pBmcPars->RunId = pData->RunId;

    if ( pData->pWla->pPars->fShrinkAbs )
        pBmcPars->nFramesMax = pData->pWla->iCexFrame + nFramesNoChangeLim;

    RetValue = Abc_NtkDarBmc3( pAbcNtk, pBmcPars, 0 );

    if ( RetValue == 0 )
    {
        assert( pAbcNtk->pSeqModel );
        *(pData->ppCex) = pAbcNtk->pSeqModel;
        pAbcNtk->pSeqModel = NULL;

        if ( pData->fVerbose )
            Abc_Print( 1, "Bmc3 found CEX. RunId=%d.\n", pData->RunId );

        status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
        ++g_nRunIds;
        status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    }
    else if ( RetValue == -1 )
    {
        if ( pData->RunId < g_nRunIds && pData->fVerbose )
            Abc_Print( 1, "Bmc3 was cancelled. RunId=%d.\n", pData->RunId );

        if ( pData->pWla->nIters > 1 && pData->RunId == g_nRunIds )
        {
            RetValue = Wla_ManShrinkAbs( pData->pWla, pData->pWla->iCexFrame + nFramesNoChangeLim, pData->RunId );
            pData->pWla->iCexFrame += nFramesNoChangeLim; 
            
            if ( RetValue == 1 )
            {
                pData->pWla->fNewAbs = 1;
                status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
                ++g_nRunIds;
                status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
            }
        }
    }

    // free memory
    Abc_NtkDelete( pAbcNtk );
    Aig_ManStop( pData->pAig );
    ABC_FREE( pData );

    // quit this thread
    pthread_exit( NULL );
    assert(0);
    return NULL;
}